

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BVSparse<Memory::JitArenaAllocator> * __thiscall
BVSparse<Memory::JitArenaAllocator>::CopyNew
          (BVSparse<Memory::JitArenaAllocator> *this,JitArenaAllocator *allocator)

{
  JitArenaAllocator *alloc;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  TrackAllocData local_48;
  BVSparse<Memory::JitArenaAllocator> *local_20;
  BVSparse<Memory::JitArenaAllocator> *bv;
  JitArenaAllocator *allocator_local;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  bv = (BVSparse<Memory::JitArenaAllocator> *)allocator;
  allocator_local = (JitArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SparseBitVector.h"
             ,0x3cc);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator
                     ,&local_48);
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,alloc,0x4e98c0);
  BVSparse(this_00,(JitArenaAllocator *)bv);
  local_20 = this_00;
  Copy<Memory::JitArenaAllocator>(this_00,this);
  return local_20;
}

Assistant:

BVSparse<TAllocator> *
BVSparse<TAllocator>::CopyNew(TAllocator* allocator) const
{
    BVSparse * bv = AllocatorNew(TAllocator, allocator, BVSparse<TAllocator>, allocator);
    bv->Copy(this);
    return bv;
}